

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitlesRender.cpp
# Opt level: O1

vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
text_subtitles::TextSubtitlesRender::processTxtLine
          (vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,TextSubtitlesRender *this,string *line,
          vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> *fontStack)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  pointer pFVar3;
  pointer pcVar4;
  long lVar5;
  double dVar6;
  byte bVar7;
  _Alloc_hider _Var8;
  size_type sVar9;
  vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
  *this_00;
  bool bVar10;
  char cVar11;
  wint_t wVar12;
  int iVar13;
  int32_t iVar14;
  pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i;
  size_t sVar15;
  const_iterator cVar16;
  long lVar17;
  vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  size_type sVar21;
  double dVar22;
  string arg;
  string ltagStr;
  string tagStr;
  string local_138;
  size_t local_118;
  string local_110;
  vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> *local_f0;
  ulong local_e8;
  string local_e0;
  string local_c0;
  vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
  *local_a0;
  ulong local_98;
  value_type local_90;
  string local_58;
  TextSubtitlesRender *local_38;
  
  if ((fontStack->super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (fontStack->super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::push_back
              (fontStack,&this->m_font);
    ((fontStack->super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>).
     _M_impl.super__Vector_impl_data._M_start)->m_size = 3;
  }
  pFVar3 = (fontStack->
           super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_90.m_name._M_dataplus._M_p = (pointer)&local_90.m_name.field_2;
  pcVar4 = pFVar3[-1].m_name._M_dataplus._M_p;
  local_38 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar4,pcVar4 + pFVar3[-1].m_name._M_string_length);
  local_90.m_color = pFVar3[-1].m_color;
  local_90.m_lineSpacing = pFVar3[-1].m_lineSpacing;
  local_90.m_size = pFVar3[-1].m_size;
  local_90.m_opts = pFVar3[-1].m_opts;
  local_90.m_borderWidth = pFVar3[-1].m_borderWidth;
  local_90.m_charset = pFVar3[-1].m_charset;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0 = (vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
              *)__return_storage_ptr__;
  if (line->_M_string_length == 0) {
    local_e8 = 0;
    uVar20 = 0;
  }
  else {
    paVar1 = &local_138.field_2;
    local_e8 = 0;
    local_98 = 0;
    bVar10 = false;
    uVar18 = 0;
    local_f0 = fontStack;
    do {
      cVar11 = (line->_M_dataplus)._M_p[uVar18];
      if (cVar11 == '<') {
        bVar10 = true;
        local_98 = uVar18;
      }
      else if ((cVar11 == '>') && (bVar10)) {
        std::__cxx11::string::substr((ulong)&local_e0,(ulong)line);
        trimStr(&local_c0,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,local_c0._M_dataplus._M_p,
                   local_c0._M_dataplus._M_p + local_c0._M_string_length);
        sVar9 = local_e0._M_string_length;
        _Var8._M_p = local_e0._M_dataplus._M_p;
        if (local_e0._M_string_length != 0) {
          sVar21 = 0;
          do {
            wVar12 = towlower((int)_Var8._M_p[sVar21]);
            _Var8._M_p[sVar21] = (char)wVar12;
            sVar21 = sVar21 + 1;
          } while (sVar9 != sVar21);
        }
        iVar13 = std::__cxx11::string::compare((char *)&local_e0);
        if ((iVar13 == 0) ||
           (iVar13 = std::__cxx11::string::compare((char *)&local_e0), iVar13 == 0)) {
          local_90._32_8_ = local_90._32_8_ | 0x200000000;
          bVar10 = true;
          bVar7 = 0;
        }
        else {
          iVar13 = std::__cxx11::string::compare((char *)&local_e0);
          if ((iVar13 == 0) ||
             (iVar13 = std::__cxx11::string::compare((char *)&local_e0), iVar13 == 0)) {
            local_90._32_8_ = local_90._32_8_ | 0x100000000;
            bVar10 = true;
            bVar7 = 0;
          }
          else {
            iVar13 = std::__cxx11::string::compare((char *)&local_e0);
            if ((iVar13 == 0) ||
               (iVar13 = std::__cxx11::string::compare((char *)&local_e0), iVar13 == 0)) {
              local_90._32_8_ = local_90._32_8_ | 0x400000000;
            }
            else {
              iVar13 = std::__cxx11::string::compare((char *)&local_e0);
              if ((iVar13 == 0) ||
                 (iVar13 = std::__cxx11::string::compare((char *)&local_e0), iVar13 == 0)) {
                local_90._32_8_ = local_90._32_8_ | 0x1000000000;
              }
              else {
                iVar13 = std::__cxx11::string::compare((char *)&local_e0);
                if (iVar13 != 0) {
                  iVar13 = std::__cxx11::string::compare((char *)&local_e0);
                  cVar11 = true;
                  if (iVar13 == 0) {
                    bVar10 = false;
                  }
                  else {
                    iVar13 = std::__cxx11::string::compare((char *)&local_e0);
                    if (((((iVar13 == 0) ||
                          (iVar13 = std::__cxx11::string::compare((char *)&local_e0), iVar13 == 0))
                         || (iVar13 = std::__cxx11::string::compare((char *)&local_e0), iVar13 == 0)
                         ) || ((iVar13 = std::__cxx11::string::compare((char *)&local_e0),
                               iVar13 == 0 ||
                               (iVar13 = std::__cxx11::string::compare((char *)&local_e0),
                               iVar13 == 0)))) ||
                       ((iVar13 = std::__cxx11::string::compare((char *)&local_e0), iVar13 == 0 ||
                        ((iVar13 = std::__cxx11::string::compare((char *)&local_e0), iVar13 == 0 ||
                         (iVar13 = std::__cxx11::string::compare((char *)&local_e0), iVar13 == 0))))
                       )) {
                      bVar10 = false;
                      cVar11 = true;
                    }
                    else {
                      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_58,"/font","");
                      cVar11 = strStartWith(&local_c0,&local_58);
                      bVar10 = true;
                    }
                  }
                  if ((bVar10) &&
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._M_dataplus._M_p != &local_58.field_2)) {
                    local_118 = CONCAT71(local_118._1_7_,cVar11);
                    operator_delete(local_58._M_dataplus._M_p,
                                    local_58.field_2._M_allocated_capacity + 1);
                    cVar11 = (char)local_118;
                  }
                  if (cVar11 == '\0') {
                    local_138._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"font ","")
                    ;
                    cVar11 = strStartWith(&local_e0,&local_138);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_dataplus._M_p != paVar1) {
                      local_118 = CONCAT71(local_118._1_7_,cVar11);
                      operator_delete(local_138._M_dataplus._M_p,
                                      local_138.field_2._M_allocated_capacity + 1);
                      cVar11 = (char)local_118;
                    }
                    if (cVar11 != '\0') {
                      local_138._M_dataplus._M_p = (pointer)paVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_138,"name","");
                      sVar15 = anon_unknown.dwarf_35b205::findUnquotedStr(&local_e0,&local_138);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_138._M_dataplus._M_p != paVar1) {
                        local_118 = sVar15;
                        operator_delete(local_138._M_dataplus._M_p,
                                        local_138.field_2._M_allocated_capacity + 1);
                        sVar15 = local_118;
                      }
                      if (sVar15 == 0xffffffffffffffff) {
                        local_138._M_dataplus._M_p = (pointer)paVar1;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_138,"face","");
                        sVar15 = anon_unknown.dwarf_35b205::findUnquotedStr(&local_e0,&local_138);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_138._M_dataplus._M_p != paVar1) {
                          local_118 = sVar15;
                          operator_delete(local_138._M_dataplus._M_p,
                                          local_138.field_2._M_allocated_capacity + 1);
                          sVar15 = local_118;
                        }
                      }
                      if (sVar15 != 0xffffffffffffffff) {
                        findFontArg(&local_110,&local_c0,sVar15);
                        unquoteStr(&local_138,&local_110);
                        std::__cxx11::string::operator=((string *)&local_90,(string *)&local_138);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_138._M_dataplus._M_p != paVar1) {
                          operator_delete(local_138._M_dataplus._M_p,
                                          local_138.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_110._M_dataplus._M_p != &local_110.field_2) {
                          operator_delete(local_110._M_dataplus._M_p,
                                          local_110.field_2._M_allocated_capacity + 1);
                        }
                      }
                      local_138._M_dataplus._M_p = (pointer)paVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_138,"color","");
                      sVar15 = anon_unknown.dwarf_35b205::findUnquotedStr(&local_e0,&local_138);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_138._M_dataplus._M_p != paVar1) {
                        local_118 = sVar15;
                        operator_delete(local_138._M_dataplus._M_p,
                                        local_138.field_2._M_allocated_capacity + 1);
                        sVar15 = local_118;
                      }
                      if (sVar15 != 0xffffffffffffffff) {
                        findFontArg(&local_110,&local_e0,sVar15);
                        unquoteStr(&local_138,&local_110);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_110._M_dataplus._M_p != &local_110.field_2) {
                          operator_delete(local_110._M_dataplus._M_p,
                                          local_110.field_2._M_allocated_capacity + 1);
                        }
                        cVar16 = std::
                                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                         *)(anonymous_namespace)::defaultPallette_abi_cxx11_,
                                        &local_138);
                        if (cVar16.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                            ._M_cur != (__node_type *)0x0) {
                          uVar2 = *(uint32_t *)
                                   ((long)cVar16.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                          ._M_cur + 0x28);
                          local_90.m_color = uVar2;
                          if ((local_138._M_string_length == 0) ||
                             ((*local_138._M_dataplus._M_p != 'x' &&
                              (*local_138._M_dataplus._M_p != '#')))) {
                            if ((local_138._M_string_length < 2) ||
                               ((*local_138._M_dataplus._M_p != '0' &&
                                (local_138._M_dataplus._M_p[1] != 'x')))) {
                              local_90.m_color = strToInt32u(local_138._M_dataplus._M_p,10);
                              goto LAB_001d3e56;
                            }
                            std::__cxx11::string::substr((ulong)&local_110,(ulong)&local_138);
                            local_90.m_color = strToInt32u(local_110._M_dataplus._M_p,0x10);
                          }
                          else {
                            std::__cxx11::string::substr((ulong)&local_110,(ulong)&local_138);
                            local_90.m_color = strToInt32u(local_110._M_dataplus._M_p,0x10);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_110._M_dataplus._M_p != &local_110.field_2) {
                            operator_delete(local_110._M_dataplus._M_p,
                                            local_110.field_2._M_allocated_capacity + 1);
                          }
                        }
LAB_001d3e56:
                        if (local_90.m_color < 0x1000000) {
                          local_90._48_8_ = local_90._48_8_ | 0xff000000;
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_138._M_dataplus._M_p != paVar1) {
                          operator_delete(local_138._M_dataplus._M_p,
                                          local_138.field_2._M_allocated_capacity + 1);
                        }
                      }
                      local_138._M_dataplus._M_p = (pointer)paVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_138,"size","");
                      sVar15 = anon_unknown.dwarf_35b205::findUnquotedStr(&local_e0,&local_138);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_138._M_dataplus._M_p != paVar1) {
                        operator_delete(local_138._M_dataplus._M_p,
                                        local_138.field_2._M_allocated_capacity + 1);
                      }
                      if (sVar15 != 0xffffffffffffffff) {
                        findFontArg(&local_110,&local_c0,sVar15);
                        unquoteStr(&local_138,&local_110);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_110._M_dataplus._M_p != &local_110.field_2) {
                          operator_delete(local_110._M_dataplus._M_p,
                                          local_110.field_2._M_allocated_capacity + 1);
                        }
                        if (local_138._M_string_length != 0) {
                          if ((*local_138._M_dataplus._M_p == '-') ||
                             (*local_138._M_dataplus._M_p == '+')) {
                            iVar14 = strToInt32(local_138._M_dataplus._M_p,10);
                            iVar13 = iVar14 + local_90.m_size;
                          }
                          else {
                            iVar13 = strToInt32(local_138._M_dataplus._M_p,10);
                          }
                          local_90.m_size = iVar13;
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_138._M_dataplus._M_p != paVar1) {
                          operator_delete(local_138._M_dataplus._M_p,
                                          local_138.field_2._M_allocated_capacity + 1);
                        }
                      }
                      goto LAB_001d3a18;
                    }
                    bVar7 = 0;
                  }
                  else {
                    bVar7 = 1;
                  }
                  bVar10 = false;
                  goto LAB_001d3a1a;
                }
                local_90._32_8_ = local_90._32_8_ | 0x800000000;
              }
            }
LAB_001d3a18:
            bVar10 = true;
            bVar7 = 0;
          }
        }
LAB_001d3a1a:
        if ((bool)(bVar7 | bVar10)) {
          if (local_e8 < local_98) {
            std::__cxx11::string::substr((ulong)&local_138,(ulong)line);
            std::
            vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
            ::emplace_back<text_subtitles::Font&,std::__cxx11::string&>
                      (local_a0,(local_f0->
                                super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                                )._M_impl.super__Vector_impl_data._M_finish + -1,&local_138);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != paVar1) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (bVar10) {
            std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::push_back
                      (local_f0,&local_90);
          }
          else {
            uVar20 = ((long)(local_f0->
                            super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_f0->
                            super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
            if (1 < uVar20) {
              std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::resize
                        (local_f0,uVar20 - 1);
              pFVar3 = (local_f0->
                       super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              std::__cxx11::string::_M_assign((string *)&local_90);
              local_90.m_color = pFVar3[-1].m_color;
              local_90.m_lineSpacing = pFVar3[-1].m_lineSpacing;
              local_90.m_size = pFVar3[-1].m_size;
              local_90.m_opts = pFVar3[-1].m_opts;
              local_90.m_borderWidth = pFVar3[-1].m_borderWidth;
              local_90.m_charset = pFVar3[-1].m_charset;
            }
          }
          local_e8 = uVar18 + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        bVar10 = false;
      }
      uVar18 = uVar18 + 1;
      uVar20 = line->_M_string_length;
    } while (uVar18 < uVar20);
  }
  this_00 = local_a0;
  if ((local_e8 & 0xffffffff) < uVar20) {
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)line);
    std::
    vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
    ::emplace_back<text_subtitles::Font&,std::__cxx11::string>(this_00,&local_90,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  lVar17 = *(long *)this_00;
  lVar5 = *(long *)(this_00 + 8);
  if (lVar17 != lVar5) {
    dVar6 = (double)(local_38->m_initFont).m_size;
    do {
      iVar13 = *(int *)(lVar17 + 0x20);
      dVar22 = dVar6;
      if (iVar13 < 4) {
        if (iVar13 != 3) {
          iVar19 = 2;
          if (2 < iVar13) {
            iVar19 = iVar13;
          }
          iVar13 = (iVar19 - iVar13) + 1;
          do {
            dVar22 = dVar22 / 1.4142135623730951;
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
      }
      else {
        iVar13 = iVar13 + -3;
        do {
          dVar22 = dVar22 * 1.4142135623730951;
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      *(int *)(lVar17 + 0x20) = (int)dVar22;
      lVar17 = lVar17 + 0x58;
    } while (lVar17 != lVar5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_name._M_dataplus._M_p != &local_90.m_name.field_2) {
    operator_delete(local_90.m_name._M_dataplus._M_p,
                    local_90.m_name.field_2._M_allocated_capacity + 1);
  }
  return (vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)this_00;
}

Assistant:

vector<pair<Font, string>> TextSubtitlesRender::processTxtLine(const std::string& line, vector<Font>& fontStack) const
{
    if (fontStack.empty())
    {
        fontStack.push_back(m_font);
        fontStack[0].m_size = DEFAULT_BROWSER_STYLE_FS;
    }
    Font curFont = fontStack[fontStack.size() - 1];

    vector<pair<Font, string>> rez;
    size_t prevTextPos = 0;
    size_t bStartPos = 0;
    bool bStartFound = false;
    for (size_t i = 0; i < line.size(); i++)
    {
        if (line[i] == '<')
        {
            bStartPos = i;
            bStartFound = true;
        }
        else if (line[i] == '>' && bStartFound)
        {
            bool isTag = false;
            bool endTag = false;
            string tagStr = trimStr(line.substr(bStartPos + 1, i - bStartPos - 1));
            string ltagStr = tagStr;
            for (auto& j : ltagStr) j = static_cast<char>(towlower(j));
            if (ltagStr == "i" || ltagStr == "italic")
            {
                curFont.m_opts |= Font::ITALIC;
                isTag = true;
            }
            else if (ltagStr == "b" || ltagStr == "bold")
            {
                curFont.m_opts |= Font::BOLD;
                isTag = true;
            }
            else if (ltagStr == "u" || ltagStr == "underline")
            {
                curFont.m_opts |= Font::UNDERLINE;
                isTag = true;
            }
            else if (ltagStr == "f" || ltagStr == "force")
            {
                curFont.m_opts |= Font::FORCED;
                isTag = true;
            }
            else if (ltagStr == "strike")
            {
                curFont.m_opts |= Font::STRIKE_OUT;
                isTag = true;
            }
            else if ((ltagStr == "/i" || ltagStr == "/italic") || (ltagStr == "/b" || ltagStr == "/bold") ||
                     (ltagStr == "/u" || ltagStr == "/underline") || (ltagStr == "/f" || ltagStr == "/force") ||
                     ltagStr == "/strike" || strStartWith(tagStr, "/font"))
            {
                endTag = true;
            }
            else if (strStartWith(ltagStr, "font "))
            {
                size_t fontNamePos = findUnquotedStr(ltagStr, "name");  // ltagStr.find("name");
                if (fontNamePos == string::npos)
                    fontNamePos = findUnquotedStr(ltagStr, "face");
                if (fontNamePos != string::npos)
                    curFont.m_name = unquoteStr(findFontArg(tagStr, fontNamePos /*, lastIndexPos*/));

                size_t colorPos = findUnquotedStr(ltagStr, "color");
                if (colorPos != string::npos)
                {
                    auto arg = unquoteStr(findFontArg(ltagStr, colorPos));
                    auto it = defaultPallette.find(arg);
                    if (it != std::end(defaultPallette))
                    {
                        curFont.m_color = it->second;
                        if (!arg.empty() && (arg[0] == '#' || arg[0] == 'x'))
                            curFont.m_color = strToInt32u(arg.substr(1, 16384).c_str(), 16);
                        else if (arg.size() > 1 && (arg[0] == '0' || arg[1] == 'x'))
                            curFont.m_color = strToInt32u(arg.substr(2, 16384).c_str(), 16);
                        else
                            curFont.m_color = strToInt32u(arg.c_str(), 10);
                    }
                    if ((curFont.m_color & 0xff000000u) == 0)
                        curFont.m_color |= 0xff000000u;
                }
                size_t fontSizePos = findUnquotedStr(ltagStr, "size");
                if (fontSizePos != string::npos)
                {
                    string arg = unquoteStr(findFontArg(tagStr, fontSizePos));
                    if (!arg.empty())
                    {
                        if (arg[0] == '+' || arg[0] == '-')
                            curFont.m_size += strToInt32(arg.c_str(), 10);
                        else
                            curFont.m_size = strToInt32(arg.c_str(), 10);
                    }
                }
                isTag = true;
            }
            if (isTag || endTag)
            {
                if (bStartPos > prevTextPos)
                {
                    string msg = line.substr(prevTextPos, bStartPos - prevTextPos);
                    rez.emplace_back(fontStack[fontStack.size() - 1], msg);
                }
                if (isTag)
                    fontStack.push_back(curFont);
                else if (fontStack.size() > 1)
                {
                    fontStack.resize(fontStack.size() - 1);
                    curFont = fontStack[fontStack.size() - 1];
                }
                prevTextPos = i + 1;
            }
            bStartFound = false;
        }
    }
    if (line.size() > static_cast<unsigned>(prevTextPos))
        rez.emplace_back(curFont, line.substr(prevTextPos, line.size() - prevTextPos));
    double rSize = m_initFont.m_size;
    for (auto& i : rez) i.first.m_size = browserSizeToRealSize(i.first.m_size, rSize);
    return rez;
}